

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLaunchData.cpp
# Opt level: O0

void __thiscall
xmrig::OclLaunchData::OclLaunchData
          (OclLaunchData *this,Miner *miner,OclConfig *config,OclPlatform *platform,
          OclThread *thread,OclDevice *device,int64_t affinity)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 *in_RCX;
  OclConfig *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  OclDevice *in_R9;
  undefined8 in_stack_00000008;
  OclThread *in_stack_ffffffffffffffa8;
  OclThread *this_00;
  OclDevice *in_stack_ffffffffffffffc8;
  
  *in_RDI = 0;
  bVar2 = OclConfig::isCacheEnabled(in_RDX);
  *(bool *)(in_RDI + 1) = bVar2;
  in_RDI[2] = in_stack_00000008;
  in_RDI[3] = in_RSI;
  this_00 = (OclThread *)(in_RDI + 4);
  OclDevice::OclDevice(in_R9,in_stack_ffffffffffffffc8);
  uVar1 = in_RCX[1];
  in_RDI[0x11] = *in_RCX;
  in_RDI[0x12] = uVar1;
  OclThread::OclThread(this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

xmrig::OclLaunchData::OclLaunchData(const Miner *miner, const OclConfig &config, const OclPlatform &platform, const OclThread &thread, const OclDevice &device, int64_t affinity) :
    cache(config.isCacheEnabled()),
    affinity(affinity),
    miner(miner),
    device(device),
    platform(platform),
    thread(thread)
{
}